

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O3

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addArgumentOperands
          (LLVMPointerGraphBuilder *this,CallInst *CI,PSNode *arg,uint idx)

{
  PSNode **ppPVar1;
  PSNode *n;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  _Var2;
  
  n = tryGetOperand(this,*(Value **)
                          (CI + ((ulong)idx * 0x20 - (ulong)(uint)(*(int *)(CI + 0x14) << 5))));
  if (n != (PSNode *)0x0) {
    ppPVar1 = (arg->super_SubgraphNode<dg::pta::PSNode>).operands.
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<dg::pta::PSNode*const*,std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>,__gnu_cxx::__ops::_Iter_pred<dg::SubgraphNode<dg::pta::PSNode>::hasOperand(dg::pta::PSNode*)const::_lambda(dg::pta::PSNode*)_1_>>
                      ((arg->super_SubgraphNode<dg::pta::PSNode>).operands.
                       super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,ppPVar1,n);
    if (_Var2._M_current == ppPVar1) {
      SubgraphNode<dg::pta::PSNode>::addOperand<dg::pta::PSNode*,dg::pta::PSNode>
                (&arg->super_SubgraphNode<dg::pta::PSNode>,n);
      return;
    }
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addArgumentOperands(const llvm::CallInst *CI,
                                                  PSNode *arg, unsigned idx) {
    assert(idx < llvmutils::getNumArgOperands(CI));
    PSNode *op = tryGetOperand(CI->getArgOperand(idx));
    if (op && !arg->hasOperand(op)) {
        // NOTE: do not add an operand multiple-times
        // (when a function is called multiple-times with
        // the same actual parameters)
        arg->addOperand(op);
    }
}